

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_unsigned_int_with_map(void)

{
  basic_variable<std::allocator<char>_> *local_190;
  basic_variable<std::allocator<char>_> *local_178;
  undefined1 local_164;
  undefined1 local_163 [2];
  undefined1 local_161;
  basic_variable<std::allocator<char>_> *local_160;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 auStack_f8 [32];
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_a8 [93];
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  uint input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe8d,"void assign_suite::assign_unsigned_int_with_map()",local_4a,&local_4b);
  local_161 = 1;
  auStack_f8._24_8_ = &local_d8;
  local_160 = &local_158;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_160,"alpha");
  local_160 = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_160,"hydrogen");
  auStack_f8._8_8_ = &local_158;
  auStack_f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_d8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_f8 + 8));
  local_161 = 0;
  local_a8._0_8_ = &local_d8;
  local_a8._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_48,
             (basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  local_178 = (basic_variable<std::allocator<char>_> *)local_a8;
  do {
    local_178 = local_178 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_178);
  } while (local_178 != &local_d8);
  local_190 = (basic_variable<std::allocator<char>_> *)auStack_f8;
  do {
    local_190 = local_190 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_190);
  } while (local_190 != &local_158);
  local_163[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_48);
  local_164 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe8f,"void assign_suite::assign_unsigned_int_with_map()",local_163,&local_164);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void assign_unsigned_int_with_map()
{
    unsigned int input = 2;
    variable data(input);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
    data = {{ "alpha", "hydrogen" }};
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
}